

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-fs-copyfile.c
# Opt level: O0

void touch_file(char *path)

{
  FILE *__stream;
  int local_1c;
  int i;
  FILE *fp;
  char *path_local;
  
  __stream = fopen64("testfile","w+");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fs-poll.c"
            ,0x3b,"(fp = fopen(FIXTURE, \"w+\"))");
    abort();
  }
  touch_file::count = touch_file::count + 1;
  local_1c = touch_file::count;
  while (local_1c != 0) {
    fputc(0x2a,__stream);
    local_1c = local_1c + -1;
  }
  fclose(__stream);
  return;
}

Assistant:

static void touch_file(const char* name, unsigned int size) {
  uv_file file;
  uv_fs_t req;
  uv_buf_t buf;
  int r;
  unsigned int i;

  r = uv_fs_open(NULL, &req, name, O_WRONLY | O_CREAT | O_TRUNC,
                 S_IWUSR | S_IRUSR, NULL);
  uv_fs_req_cleanup(&req);
  ASSERT(r >= 0);
  file = r;

  buf = uv_buf_init("a", 1);

  /* Inefficient but simple. */
  for (i = 0; i < size; i++) {
    r = uv_fs_write(NULL, &req, file, &buf, 1, i, NULL);
    uv_fs_req_cleanup(&req);
    ASSERT(r >= 0);
  }

  r = uv_fs_close(NULL, &req, file, NULL);
  uv_fs_req_cleanup(&req);
  ASSERT(r == 0);
}